

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void create_odither_tables(j_decompress_ptr cinfo)

{
  int ncolors;
  jpeg_color_quantizer *pjVar1;
  int local_28;
  int nci;
  int j;
  int i;
  ODITHER_MATRIX_PTR odither;
  my_cquantize_ptr cquantize;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->cquantize;
  nci = 0;
  do {
    if (cinfo->out_color_components <= nci) {
      return;
    }
    ncolors = *(int *)((long)&pjVar1[1].new_color_map + (long)nci * 4 + 4);
    _j = (ODITHER_MATRIX_PTR)0x0;
    for (local_28 = 0; local_28 < nci; local_28 = local_28 + 1) {
      if (ncolors == *(int *)((long)&pjVar1[1].new_color_map + (long)local_28 * 4 + 4)) {
        _j = (ODITHER_MATRIX_PTR)(&pjVar1[2].finish_pass)[local_28];
        break;
      }
    }
    if (_j == (ODITHER_MATRIX_PTR)0x0) {
      _j = make_odither_array(cinfo,ncolors);
    }
    (&pjVar1[2].finish_pass)[nci] = (_func_void_j_decompress_ptr *)_j;
    nci = nci + 1;
  } while( true );
}

Assistant:

LOCAL(void)
create_odither_tables (j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  ODITHER_MATRIX_PTR odither;
  int i, j, nci;

  for (i = 0; i < cinfo->out_color_components; i++) {
    nci = cquantize->Ncolors[i]; /* # of distinct values for this color */
    odither = NULL;		/* search for matching prior component */
    for (j = 0; j < i; j++) {
      if (nci == cquantize->Ncolors[j]) {
	odither = cquantize->odither[j];
	break;
      }
    }
    if (odither == NULL)	/* need a new table? */
      odither = make_odither_array(cinfo, nci);
    cquantize->odither[i] = odither;
  }
}